

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O0

bool bc7decomp::unpack_bc7_mode4_5(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint32_t uVar1;
  uint l;
  uint8_t *puVar2;
  byte *pbVar3;
  long in_RDX;
  int in_EDI;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t c_2;
  uint32_t i_2;
  color_rgba block_colors [8];
  uint32_t c_1;
  uint32_t e_1;
  uint32_t i_1;
  uint32_t i;
  uint32_t a_weights [16];
  uint32_t weights [16];
  uint32_t weight_bits [2];
  uint32_t e;
  uint32_t c;
  color_rgba endpoints [2];
  uint32_t index_mode;
  uint32_t comp_rot;
  uint8_t *pBuf;
  uint32_t bit_offset;
  uint32_t A_ENDPOINT_BITS;
  uint32_t ENDPOINT_BITS;
  uint32_t A_WEIGHT_BITS;
  uint32_t WEIGHT_BITS;
  uint32_t COMPS;
  uint32_t ENDPOINTS;
  uint32_t in_stack_fffffffffffffe38;
  uint32_t in_stack_fffffffffffffe3c;
  uint32_t in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe50;
  anon_union_4_2_6eba8969_for_color_rgba_0 *this;
  uint32_t *in_stack_fffffffffffffe58;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar4;
  uint8_t *in_stack_fffffffffffffe60;
  uint32_t local_190;
  uint *local_188;
  uint *local_178;
  undefined4 local_16c;
  undefined4 local_15c;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_138;
  uint32_t local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_118 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8 [16];
  uint local_a8 [18];
  undefined4 local_60;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_50 [3];
  uint32_t local_44;
  undefined4 local_34;
  uint32_t local_30;
  uint32_t local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  int local_8;
  bool local_1;
  
  local_1c = 2;
  local_20 = 4;
  local_24 = 2;
  local_28 = 2;
  if (in_EDI == 4) {
    local_28 = 3;
  }
  local_2c = 7;
  if (in_EDI == 4) {
    local_2c = 5;
  }
  local_30 = 8;
  if (in_EDI == 4) {
    local_30 = 6;
  }
  local_34 = 0;
  local_18 = in_RDX;
  local_8 = in_EDI;
  uVar1 = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  if (uVar1 == 1 << ((byte)local_8 & 0x1f)) {
    local_44 = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                           (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    if (local_8 == 4) {
      local_12c = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                              (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    }
    else {
      local_12c = 0;
    }
    local_50[2] = (anon_union_4_2_6eba8969_for_color_rgba_0)local_12c;
    local_138 = local_50;
    do {
      color_rgba::color_rgba((color_rgba *)&local_138->field_1);
      local_138 = local_138 + 1;
    } while (local_138 != local_50 + 2);
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
        uVar1 = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                            (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        puVar2 = color_rgba::operator[]((color_rgba *)&local_50[local_58].field_1,local_54);
        *puVar2 = (uint8_t)uVar1;
      }
    }
    if (local_50[2] == (anon_union_4_2_6eba8969_for_color_rgba_0)0x0) {
      local_15c = 2;
    }
    else {
      local_15c = local_28;
    }
    local_60 = local_15c;
    if (local_50[2] == (anon_union_4_2_6eba8969_for_color_rgba_0)0x0) {
      local_16c = local_28;
    }
    else {
      local_16c = 2;
    }
    local_5c = local_16c;
    for (local_ec = 0; local_ec < 0x10; local_ec = local_ec + 1) {
      uVar1 = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      if (local_50[2] == (anon_union_4_2_6eba8969_for_color_rgba_0)0x0) {
        local_178 = local_a8;
      }
      else {
        local_178 = local_e8;
      }
      local_178[local_ec] = uVar1;
    }
    for (local_f0 = 0; local_f0 < 0x10; local_f0 = local_f0 + 1) {
      uVar1 = read_bits32(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      if (local_50[2] == (anon_union_4_2_6eba8969_for_color_rgba_0)0x0) {
        local_188 = local_e8;
      }
      else {
        local_188 = local_a8;
      }
      local_188[local_f0] = uVar1;
    }
    for (local_f4 = 0; local_f4 < 2; local_f4 = local_f4 + 1) {
      for (local_f8 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0; (uint)local_f8 < 4;
          local_f8.m_comps = local_f8.m_comps + 1) {
        pbVar3 = color_rgba::operator[]
                           ((color_rgba *)&local_50[local_f4].field_1,(uint32_t)local_f8);
        if (local_f8 == (anon_union_4_2_6eba8969_for_color_rgba_0)0x3) {
          local_190 = local_30;
        }
        else {
          local_190 = local_2c;
        }
        uVar1 = bc7_dequant((uint)*pbVar3,local_190);
        puVar2 = color_rgba::operator[]
                           ((color_rgba *)&local_50[local_f4].field_1,(uint32_t)local_f8);
        *puVar2 = (uint8_t)uVar1;
      }
    }
    this = local_118;
    paVar4 = &local_f8;
    do {
      color_rgba::color_rgba((color_rgba *)&this->field_1);
      this = this + 1;
    } while (this != paVar4);
    for (local_11c = 0; local_11c < (uint)(1 << ((byte)local_60 & 0x1f)); local_11c = local_11c + 1)
    {
      for (local_120 = 0; local_120 < 3; local_120 = local_120 + 1) {
        color_rgba::operator[]((color_rgba *)&local_50[0].field_1,local_120);
        color_rgba::operator[]((color_rgba *)&local_50[1].field_1,local_120);
        uVar1 = bc7_interp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                           in_stack_fffffffffffffe38,0);
        puVar2 = color_rgba::operator[]((color_rgba *)&local_118[local_11c].field_1,local_120);
        *puVar2 = (uint8_t)uVar1;
      }
    }
    for (local_124 = 0; local_124 < (uint)(1 << ((byte)local_5c & 0x1f)); local_124 = local_124 + 1)
    {
      pbVar3 = color_rgba::operator[]((color_rgba *)&local_50[0].field_1,3);
      l = (uint)*pbVar3;
      color_rgba::operator[]((color_rgba *)&local_50[1].field_1,3);
      uVar1 = bc7_interp(l,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,0);
      puVar2 = color_rgba::operator[]((color_rgba *)&local_118[local_124].field_1,3);
      *puVar2 = (uint8_t)uVar1;
    }
    for (local_128 = 0; local_128 < 0x10; local_128 = local_128 + 1) {
      *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_18 + (ulong)local_128 * 4) =
           local_118[local_a8[local_128]];
      *(uint8_t *)(local_18 + 3 + (ulong)local_128 * 4) = local_118[local_e8[local_128]].field_1.a;
      if (local_44 != 0) {
        std::swap<unsigned_char>
                  ((uchar *)(local_18 + (ulong)local_128 * 4 + 3),
                   (uchar *)(local_18 + (ulong)local_128 * 4 + (ulong)(local_44 - 1)));
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unpack_bc7_mode4_5(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	const uint32_t ENDPOINTS = 2;
	const uint32_t COMPS = 4;
	const uint32_t WEIGHT_BITS = 2;
	const uint32_t A_WEIGHT_BITS = (mode == 4) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 4) ? 5 : 7;
	const uint32_t A_ENDPOINT_BITS = (mode == 4) ? 6 : 8;
	//const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
	//const uint32_t A_WEIGHT_VALS = 1 << A_WEIGHT_BITS;

	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t comp_rot = read_bits32(pBuf, bit_offset, 2);
	const uint32_t index_mode = (mode == 4) ? read_bits32(pBuf, bit_offset, 1) : 0;

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);
		
	const uint32_t weight_bits[2] = { index_mode ? A_WEIGHT_BITS : WEIGHT_BITS,  index_mode ? WEIGHT_BITS : A_WEIGHT_BITS };
		
	uint32_t weights[16], a_weights[16];
		
	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? a_weights : weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[index_mode] - ((!i) ? 1 : 0));

	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? weights : a_weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[1 - index_mode] - ((!i) ? 1 : 0));

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)bc7_dequant(endpoints[e][c], (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);

	color_rgba block_colors[8];
	for (uint32_t i = 0; i < (1U << weight_bits[0]); i++)
		for (uint32_t c = 0; c < 3; c++)
			block_colors[i][c] = (uint8_t)bc7_interp(endpoints[0][c], endpoints[1][c], i, weight_bits[0]);

	for (uint32_t i = 0; i < (1U << weight_bits[1]); i++)
		block_colors[i][3] = (uint8_t)bc7_interp(endpoints[0][3], endpoints[1][3], i, weight_bits[1]);

	for (uint32_t i = 0; i < 16; i++)
	{
		pPixels[i] = block_colors[weights[i]];
		pPixels[i].a = block_colors[a_weights[i]].a;
		if (comp_rot >= 1)
			std::swap(pPixels[i].a, pPixels[i].m_comps[comp_rot - 1]);
	}

	return true;
}